

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O3

Cdr * __thiscall
eprosima::fastcdr::Cdr::deserialize(Cdr *this,char **string_t,Endianness endianness)

{
  bool bVar1;
  
  bVar1 = this->m_swapBytes;
  this->m_swapBytes = (bool)(this->m_endianness != endianness ^ bVar1);
  deserialize(this,string_t);
  this->m_swapBytes = bVar1;
  return this;
}

Assistant:

Cdr& Cdr::deserialize(char *&string_t, Endianness endianness)
{
    bool auxSwap = m_swapBytes;
    m_swapBytes = (m_swapBytes && (m_endianness == endianness)) || (!m_swapBytes && (m_endianness != endianness));

    try
    {
        deserialize(string_t);
        m_swapBytes = auxSwap;
    }
    catch(Exception &ex)
    {
        m_swapBytes = auxSwap;
        ex.raise();
    }

    return *this;
}